

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void openjtalk_setAlpha(OpenJTalk *oj,double f)

{
  long in_RDI;
  Open_JTalk *in_XMM0_Qa;
  double in_stack_ffffffffffffffe8;
  
  if (in_RDI == 0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    *(undefined4 *)(in_RDI + 0x678) = 0;
    if (0.0 <= (double)in_XMM0_Qa) {
      if (1.0 < (double)in_XMM0_Qa) {
        in_XMM0_Qa = (Open_JTalk *)0x3ff0000000000000;
      }
    }
    else {
      in_XMM0_Qa = (Open_JTalk *)0x0;
    }
    *(Open_JTalk **)(in_RDI + 0x648) = in_XMM0_Qa;
    Open_JTalk_set_alpha(in_XMM0_Qa,in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_setAlpha(OpenJTalk *oj, double f)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (f < 0.0)
	{
		f = 0.0;
	}
	else if (f > 1.0)
	{
		f = 1.0;
	}
	oj->alpha = f;
	Open_JTalk_set_alpha(oj->open_jtalk, oj->alpha);
}